

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

AggregateInitialiserList * __thiscall
soul::heart::Parser::parseInitialiserList(Parser *this,FunctionParseState *state,Type *type)

{
  bool bVar1;
  Module *this_00;
  AggregateInitialiserList *pAVar2;
  size_t sVar3;
  Expression *o;
  pool_ref<soul::heart::Expression> local_78 [3];
  Type local_60;
  Expression *local_48;
  Expression *arg;
  anon_class_1_0_00000001 local_31;
  char *pcStack_30;
  anon_class_1_0_00000001 getAggregateElementType;
  AggregateInitialiserList *list;
  Type *type_local;
  FunctionParseState *state_local;
  Parser *this_local;
  
  this_00 = pool_ptr<soul::Module>::operator->(&this->module);
  pAVar2 = Module::
           allocate<soul::heart::AggregateInitialiserList,soul::CodeLocation&,soul::Type_const&>
                     (this_00,&(this->
                               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                               ).location,type);
  pcStack_30 = "(";
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x573c42);
  arg = (Expression *)0x571824;
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x571824);
  if (!bVar1) {
    do {
      sVar3 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::size
                        (&pAVar2->items);
      parseInitialiserList::anon_class_1_0_00000001::operator()
                (&local_60,&local_31,type,(uint32_t)sVar3);
      o = parseExpression(this,state,&local_60);
      Type::~Type(&local_60);
      local_48 = o;
      pool_ref<soul::heart::Expression>::pool_ref<soul::heart::Expression,void>(local_78,o);
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
                (&pAVar2->items,local_78);
      pool_ref<soul::heart::Expression>::~pool_ref(local_78);
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)",");
    } while (bVar1);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x571824);
  }
  return pAVar2;
}

Assistant:

heart::AggregateInitialiserList& parseInitialiserList (const FunctionParseState& state, const Type& type)
    {
        auto& list = module->allocate<heart::AggregateInitialiserList> (location, type);
        expect (HEARTOperator::openParen);

        auto getAggregateElementType = [] (const Type& t, uint32_t index)
        {
            if (t.isFixedSizeAggregate())
            {
                SOUL_ASSERT (index < t.getNumAggregateElements());
                return t.isStruct() ? t.getStructRef().getMemberType (index)
                                    : t.getElementType();
            }

            SOUL_ASSERT (index == 0);
            return t;
        };

        if (! matchIf (HEARTOperator::closeParen))
        {
            for (;;)
            {
                auto& arg = parseExpression (state, getAggregateElementType (type, static_cast<uint32_t> (list.items.size())));
                list.items.push_back (arg);

                if (matchIf (HEARTOperator::comma))
                    continue;

                expect (HEARTOperator::closeParen);
                break;
            }
        }

        return list;
    }